

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPDUHandler.cpp
# Opt level: O1

bool handleSetRequestPDU(deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *callbacks,
                        deque<VarBind,_std::allocator<VarBind>_> *varbindList,
                        deque<VarBind,_std::allocator<VarBind>_> *outResponseList,
                        SNMP_VERSION snmpVersion)

{
  _Elt_pointer pVVar1;
  SNMP_ERROR_STATUS SVar2;
  ValueCallback *callback;
  _Elt_pointer __args;
  _Map_pointer ppVVar3;
  _Elt_pointer pVVar4;
  shared_ptr<BER_CONTAINER> value;
  ValueCallback local_58;
  SNMP_ERROR_STATUS local_40;
  ERROR_STATUS_WITH_VALUE local_3c;
  deque<ValueCallback_*,_std::allocator<ValueCallback_*>_> *local_38;
  
  __args = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pVVar1 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (__args != pVVar1) {
    pVVar4 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
    ppVVar3 = (varbindList->super__Deque_base<VarBind,_std::allocator<VarBind>_>)._M_impl.
              super__Deque_impl_data._M_start._M_node;
    local_58._20_4_ = (uint)(snmpVersion != SNMP_VERSION_1) * 4 + BAD_VALUE;
    local_40 = NOT_WRITABLE;
    local_38 = callbacks;
    if (snmpVersion == SNMP_VERSION_1) {
      local_40 = NO_SUCH_NAME;
    }
    do {
      callback = ValueCallback::findCallback
                           (local_38,(__args->oid).
                                     super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            false,0,(size_t *)0x0);
      SVar2 = local_40;
      if ((callback == (ValueCallback *)0x0) ||
         (SVar2 = local_58._20_4_, callback->type != __args->type)) {
LAB_001095c3:
        local_58._vptr_ValueCallback._0_4_ = SVar2;
        std::deque<VarBind,std::allocator<VarBind>>::
        emplace_back<std::shared_ptr<OIDType>const&,ERROR_STATUS_WITH_VALUE>
                  ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&__args->oid,
                   (ERROR_STATUS_WITH_VALUE *)&local_58);
      }
      else {
        if (callback->isSettable == false) {
          local_58._vptr_ValueCallback._0_4_ = READ_ONLY;
          SVar2 = (SNMP_ERROR_STATUS)local_58._vptr_ValueCallback;
          goto LAB_001095c3;
        }
        SVar2 = ValueCallback::setValueForCallback(callback,&__args->value);
        if (SVar2 == NO_ERROR) {
          ValueCallback::getValueForCallback(&local_58,callback);
          if (CONCAT44(local_58._vptr_ValueCallback._4_4_,
                       (SNMP_ERROR_STATUS)local_58._vptr_ValueCallback) == 0) {
            local_3c = GEN_ERR;
            std::deque<VarBind,std::allocator<VarBind>>::
            emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                      ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&callback->OID,
                       &local_3c);
          }
          else {
            std::deque<VarBind,std::allocator<VarBind>>::
            emplace_back<SortableOIDType*const&,std::shared_ptr<BER_CONTAINER>&>
                      ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&callback->OID,
                       (shared_ptr<BER_CONTAINER> *)&local_58);
          }
          if (local_58.OID != (SortableOIDType *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.OID);
          }
        }
        else {
          local_58._vptr_ValueCallback._0_4_ = GEN_ERR;
          if ((int)SVar2 < 5) {
            local_58._vptr_ValueCallback._0_4_ = SVar2;
          }
          if (snmpVersion != SNMP_VERSION_1) {
            local_58._vptr_ValueCallback._0_4_ = SVar2;
          }
          std::deque<VarBind,std::allocator<VarBind>>::
          emplace_back<SortableOIDType*const&,ERROR_STATUS_WITH_VALUE>
                    ((deque<VarBind,std::allocator<VarBind>> *)outResponseList,&callback->OID,
                     (ERROR_STATUS_WITH_VALUE *)&local_58);
        }
      }
      __args = __args + 1;
      if (__args == pVVar4) {
        __args = ppVVar3[1];
        ppVVar3 = ppVVar3 + 1;
        pVVar4 = __args + 10;
      }
    } while (__args != pVVar1);
  }
  return true;
}

Assistant:

bool handleSetRequestPDU(std::deque<ValueCallback*> &callbacks, std::deque<VarBind> &varbindList, std::deque<VarBind> &outResponseList, SNMP_VERSION snmpVersion){
    SNMP_LOGD("handleSetRequestPDU\n");
    for(const VarBind& requestVarBind : varbindList){
        SNMP_LOGD("finding callback for OID: %s\n", requestVarBind.oid->string().c_str());
        ValueCallback* callback = ValueCallback::findCallback(callbacks, requestVarBind.oid.get(), false);
        if(!callback){
            SNMP_LOGD("Couldn't find callback\n");
            outResponseList.emplace_back(requestVarBind.oid, SNMP_ERROR_VERSION_CTRL_DEF(NOT_WRITABLE, snmpVersion, NO_SUCH_NAME));
            continue;
        }

        SNMP_LOGD("Callback found with OID: %s\n", callback->OID->string().c_str());

        if(callback->type != requestVarBind.type){
            SNMP_LOGD("Callback Type mismatch: %d\n", callback->type);
            outResponseList.emplace_back(requestVarBind.oid, SNMP_ERROR_VERSION_CTRL_DEF(WRONG_TYPE, snmpVersion, BAD_VALUE));
            continue;
        }
        
        if(!callback->isSettable){
            SNMP_LOGD("Cannot set this object\n");
            outResponseList.emplace_back(requestVarBind.oid, SNMP_ERROR_VERSION_CTRL(READ_ONLY, snmpVersion));
            continue;
        }
        //NOTE: we could just use the same pointer as the reqwuest, but delete the value and add a new one. Will have to figure out what to do if it errors, do that later
        SNMP_ERROR_STATUS setError = ValueCallback::setValueForCallback(callback, requestVarBind.value);
        if(setError != NO_ERROR){
            SNMP_LOGD("Attempting to set Variable failed: %d\n", setError);
            outResponseList.emplace_back(callback->OID, SNMP_ERROR_VERSION_CTRL(setError, snmpVersion));
            continue;   
        }

        auto value = ValueCallback::getValueForCallback(callback);

        if(!value){
            SNMP_LOGD("Couldn't get value for callback\n");
            outResponseList.emplace_back(callback->OID, SNMP_ERROR_VERSION_CTRL(GEN_ERR, snmpVersion));
            continue;   
        }

        outResponseList.emplace_back(callback->OID, value);
    }
    return true; // we didn't fail in our job

}